

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlst.cpp
# Opt level: O1

int CVmObjList::getp_index_of(vm_val_t *retval,vm_val_t *self_val,char *lst,uint *argc)

{
  int iVar1;
  size_t idx;
  vm_val_t subval;
  vm_obj_id_t local_30 [2];
  vm_val_t local_28;
  
  if (getp_index_of(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc == '\0') {
    getp_index_of();
  }
  iVar1 = CVmObject::get_prop_check_argc(retval,argc,&getp_index_of::desc);
  if (iVar1 == 0) {
    local_28.typ = sp_[-1].typ;
    local_28._4_4_ = *(undefined4 *)&sp_[-1].field_0x4;
    local_28.val = sp_[-1].val;
    sp_ = sp_ + -1;
    iVar1 = find_in_list(self_val,&local_28,(size_t *)local_30);
    if (iVar1 == 0) {
      retval->typ = VM_NIL;
    }
    else {
      retval->typ = VM_INT;
      (retval->val).obj = local_30[0];
    }
  }
  return 1;
}

Assistant:

int CVmObjList::getp_index_of(VMG_ vm_val_t *retval, const vm_val_t *self_val,
                              const char *lst, uint *argc)
{
    vm_val_t subval;
    size_t idx;
    static CVmNativeCodeDesc desc(1);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* pop the value to find */
    G_stk->pop(&subval);

    /* find the value in the list */
    if (find_in_list(vmg_ self_val, &subval, &idx))
    {
        /* found it - adjust to 1-based index for return */
        retval->set_int(idx);
    }
    else
    {
        /* didn't find it - return nil */
        retval->set_nil();
    }

    /* handled */
    return TRUE;
}